

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int tkinter2Present(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char lPythonParams [256];
  char lPythonCommand [256];
  
  memcpy(lPythonParams,"-S -c \"try:\n\timport Tkinter;\nexcept:\n\tprint 0;\"",0x100);
  if (tkinter2Present::lTkinter2Present < 0) {
    tkinter2Present::lTkinter2Present = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      sprintf(lPythonCommand,"%s %s",gPython2Name,lPythonParams);
      tkinter2Present::lTkinter2Present = tryCommand(lPythonCommand);
    }
    if (tinyfd_verbose != 0) {
      printf("lTkinter2Present %d\n",(ulong)(uint)tkinter2Present::lTkinter2Present);
    }
  }
  uVar3 = 0;
  if ((tkinter2Present::lTkinter2Present != 0) && (iVar1 = graphicMode(), iVar1 != 0)) {
    iVar1 = isDarwin();
    if (iVar1 == 0) {
      uVar3 = 1;
    }
    else {
      pcVar2 = getenv("SSH_TTY");
      uVar3 = (uint)(pcVar2 == (char *)0x0);
    }
  }
  return uVar3;
}

Assistant:

static int tkinter2Present( )
{
    static int lTkinter2Present = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
"-S -c \"try:\n\timport Tkinter;\nexcept:\n\tprint 0;\"";


        if ( lTkinter2Present < 0 )
        {
                lTkinter2Present = 0 ;
                if ( python2Present() )
        {
                    sprintf( lPythonCommand , "%s %s" , gPython2Name , lPythonParams ) ;
                    lTkinter2Present = tryCommand(lPythonCommand) ;
                }
                if (tinyfd_verbose) printf("lTkinter2Present %d\n", lTkinter2Present) ;
        }
        return lTkinter2Present && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}